

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dependency_manager.cpp
# Opt level: O0

void __thiscall
duckdb::DependencyManager::VerifyCommitDrop
          (DependencyManager *this,CatalogTransaction transaction,transaction_t start_time,
          CatalogEntry *object)

{
  CatalogTransaction transaction_00;
  CatalogTransaction transaction_01;
  bool bVar1;
  CatalogEntry *in_RDX;
  DependencyManager *in_RDI;
  undefined8 in_stack_00000008;
  CatalogEntryInfo *in_stack_00000010;
  anon_class_16_2_59f9c60e *in_stack_00000018;
  function<void_(duckdb::DependencyEntry_&)> *in_stack_00000020;
  CatalogEntryInfo info;
  anon_class_16_2_59f9c60e *in_stack_fffffffffffffe98;
  anon_class_16_2_59f9c60e *__f;
  function<void_(duckdb::DependencyEntry_&)> *in_stack_fffffffffffffea0;
  function<void_(duckdb::DependencyEntry_&)> *this_00;
  dependency_callback_t *in_stack_fffffffffffffee0;
  CatalogEntry *in_stack_fffffffffffffee8;
  DependencyManager *in_stack_fffffffffffffef0;
  undefined8 in_stack_ffffffffffffff00;
  undefined8 in_stack_ffffffffffffff08;
  undefined8 in_stack_ffffffffffffff10;
  undefined8 in_stack_ffffffffffffff18;
  transaction_t in_stack_ffffffffffffff20;
  
  bVar1 = IsSystemEntry(in_RDI,in_RDX);
  if (!bVar1) {
    GetLookupProperties(in_stack_fffffffffffffee8);
    this_00 = in_stack_00000020;
    ::std::function<void(duckdb::DependencyEntry&)>::
    function<duckdb::DependencyManager::VerifyCommitDrop(duckdb::CatalogTransaction,unsigned_long,duckdb::CatalogEntry&)::__0,void>
              (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    transaction_00.context.ptr = (ClientContext *)in_stack_ffffffffffffff08;
    transaction_00.db.ptr = (DatabaseInstance *)in_stack_ffffffffffffff00;
    transaction_00.transaction.ptr = (Transaction *)in_stack_ffffffffffffff10;
    transaction_00.transaction_id = in_stack_ffffffffffffff18;
    transaction_00.start_time = in_stack_ffffffffffffff20;
    __f = in_stack_00000018;
    ScanDependents(in_stack_fffffffffffffef0,transaction_00,
                   (CatalogEntryInfo *)in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
    ::std::function<void_(duckdb::DependencyEntry_&)>::~function
              ((function<void_(duckdb::DependencyEntry_&)> *)0x2a9c46);
    ::std::function<void(duckdb::DependencyEntry&)>::
    function<duckdb::DependencyManager::VerifyCommitDrop(duckdb::CatalogTransaction,unsigned_long,duckdb::CatalogEntry&)::__1,void>
              (this_00,__f);
    transaction_01.context.ptr = (ClientContext *)in_stack_00000008;
    transaction_01.db.ptr = (DatabaseInstance *)in_stack_ffffffffffffff00;
    transaction_01.transaction.ptr = (Transaction *)in_stack_00000010;
    transaction_01.transaction_id = (transaction_t)in_stack_00000018;
    transaction_01.start_time = (transaction_t)in_stack_00000020;
    ScanSubjects(in_stack_fffffffffffffef0,transaction_01,
                 (CatalogEntryInfo *)in_stack_fffffffffffffee8,(dependency_callback_t *)in_RDX);
    ::std::function<void_(duckdb::DependencyEntry_&)>::~function
              ((function<void_(duckdb::DependencyEntry_&)> *)0x2a9ce5);
    CatalogEntryInfo::~CatalogEntryInfo(in_stack_00000010);
  }
  return;
}

Assistant:

void DependencyManager::VerifyCommitDrop(CatalogTransaction transaction, transaction_t start_time,
                                         CatalogEntry &object) {
	if (IsSystemEntry(object)) {
		return;
	}
	auto info = GetLookupProperties(object);
	ScanDependents(transaction, info, [&](DependencyEntry &dep) {
		auto dep_committed_at = dep.timestamp.load();
		if (dep_committed_at > start_time) {
			// In the event of a CASCADE, the dependency drop has not committed yet
			// so we would be halted by the existence of a dependency we are already dropping unless we check the
			// timestamp
			//
			// Which differentiates between objects that we were already aware of (and will subsequently be dropped) and
			// objects that were introduced inbetween, which should cause this error:
			throw DependencyException(
			    "Could not commit DROP of \"%s\" because a dependency was created after the transaction started",
			    object.name);
		}
	});
	ScanSubjects(transaction, info, [&](DependencyEntry &dep) {
		auto dep_committed_at = dep.timestamp.load();
		if (!dep.Dependent().flags.IsOwnedBy()) {
			return;
		}
		D_ASSERT(dep.Subject().flags.IsOwnership());
		if (dep_committed_at > start_time) {
			// Same as above, objects that are owned by the object that is being dropped will be dropped as part of this
			// transaction. Only objects that were introduced by other transactions, that this transaction could not
			// see, should cause this error:
			throw DependencyException(
			    "Could not commit DROP of \"%s\" because a dependency was created after the transaction started",
			    object.name);
		}
	});
}